

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall ArgsManager::ParseParameters(ArgsManager *this,int argc,char **argv,string *error)

{
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  string *error_00;
  uint *puVar4;
  mapped_type *pmVar5;
  SettingsValue *__rhs;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  mapped_type *includes;
  size_t is_index;
  int i;
  SettingsSpan values;
  optional<unsigned_int> flags;
  optional<unsigned_int> flags_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  optional<UniValue> value;
  KeyInfo keyinfo;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> val;
  string key;
  KeyInfo *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  char **in_stack_fffffffffffffd20;
  char *__lhs;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffd40;
  ArgsManager *in_stack_fffffffffffffd48;
  ArgsManager *in_stack_fffffffffffffd50;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffd58;
  char cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffd68;
  undefined1 *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  KeyInfo *key_00;
  int local_23c;
  byte local_211;
  char local_210 [23];
  allocator<char> local_1f9;
  _Optional_payload_base<unsigned_int> local_1f8;
  _Optional_payload_base<unsigned_int> local_1f0;
  UniValue local_1d8 [4];
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd08);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd40,
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
             SUB41((uint)in_stack_fffffffffffffd28 >> 0x18,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           *)in_stack_fffffffffffffd08);
  for (local_23c = 1; local_23c < in_ESI; local_23c = local_23c + 1) {
    key_00 = *(KeyInfo **)(in_RDX + (long)local_23c * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)in_stack_fffffffffffffd48);
    std::allocator<char>::~allocator(&local_1f9);
    uVar1 = std::operator==(in_stack_fffffffffffffd18,
                            (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    if ((bool)uVar1) {
      cVar6 = '\x02';
    }
    else {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd08);
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd50,in_stack_fffffffffffffd58._7_1_,
                         (size_type)in_stack_fffffffffffffd48);
      if (sVar3 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffd30,
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (size_type)in_stack_fffffffffffffd20);
        in_stack_fffffffffffffd78 = local_70;
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffd18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
        std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (size_type)in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18);
      }
      error_00 = (string *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_fffffffffffffd18,
                            CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
      if (*(char *)&(error_00->_M_dataplus)._M_p == '-') {
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(&in_stack_fffffffffffffd08->name);
        cVar6 = in_stack_fffffffffffffd58._7_1_;
        if ((1 < sVar3) &&
           (in_stack_fffffffffffffd60 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_fffffffffffffd18,
                            CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10)),
           *(char *)&(in_stack_fffffffffffffd60->_M_dataplus)._M_p == '-')) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (size_type)in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (size_type)in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd48);
        InterpretKey((string *)in_stack_fffffffffffffd50);
        std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
        std::operator+(cVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd50);
        in_stack_fffffffffffffd58 =
             (_Optional_payload_base<unsigned_int>)
             GetArgFlags(in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
        local_1f8 = in_stack_fffffffffffffd58;
        std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<unsigned_int> *)in_stack_fffffffffffffd08);
        if ((bVar2) &&
           (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty(&in_stack_fffffffffffffd08->name), bVar2)) {
          bVar2 = std::optional::operator_cast_to_bool
                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffd08);
          if (bVar2) {
            in_stack_fffffffffffffd48 =
                 (ArgsManager *)
                 std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffd08);
          }
          else {
            in_stack_fffffffffffffd48 = (ArgsManager *)0x0;
          }
          in_stack_fffffffffffffd50 = in_stack_fffffffffffffd48;
          std::optional<unsigned_int>::operator*
                    ((optional<unsigned_int> *)in_stack_fffffffffffffd08);
          InterpretValue(key_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffd80),
                         (uint)((ulong)in_stack_fffffffffffffd78 >> 0x20),error_00);
          bVar2 = std::optional::operator_cast_to_bool
                            ((optional<UniValue> *)in_stack_fffffffffffffd08);
          if (bVar2) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                          *)in_stack_fffffffffffffd30,
                         (key_type *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
            std::optional<UniValue>::operator*((optional<UniValue> *)in_stack_fffffffffffffd08);
            std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                      ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffd18,
                       (value_type *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
          }
          else {
            local_211 = 0;
          }
          cVar6 = !bVar2;
          std::optional<UniValue>::~optional((optional<UniValue> *)in_stack_fffffffffffffd08);
        }
        else {
          tinyformat::format<char_const*>
                    ((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (char **)in_stack_fffffffffffffd30);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
          std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
          local_211 = 0;
          cVar6 = true;
        }
        KeyInfo::~KeyInfo(in_stack_fffffffffffffd08);
      }
      else {
        if (((*(byte *)(in_RDI + 0x180) & 1) == 0) &&
           (bVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffd18), bVar2)) {
          in_stack_fffffffffffffd68 =
               (_Optional_payload_base<unsigned_int>)
               GetArgFlags(in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
          local_1f0 = in_stack_fffffffffffffd68;
          bVar2 = std::optional::operator_cast_to_bool
                            ((optional<unsigned_int> *)in_stack_fffffffffffffd08);
          if ((!bVar2) ||
             (puVar4 = std::optional<unsigned_int>::operator*
                                 ((optional<unsigned_int> *)in_stack_fffffffffffffd08),
             (*puVar4 & 0x800) == 0)) {
            tinyformat::format<char_const*>
                      ((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                       (char **)in_stack_fffffffffffffd30);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
            std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
            local_211 = 0;
            cVar6 = '\x01';
            goto LAB_0016bd00;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd18,
                    (value_type *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
        while (local_23c = local_23c + 1, local_23c < in_ESI) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     in_stack_fffffffffffffd20);
        }
        cVar6 = '\x02';
      }
LAB_0016bd00:
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffd08);
    }
    std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
    if (cVar6 != '\0') {
      if (cVar6 != '\x02') goto LAB_0016bef9;
      break;
    }
    in_stack_fffffffffffffd3c = 0;
  }
  pmVar5 = common::
           FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>&,char_const(&)[12]>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                       *)in_stack_fffffffffffffd50,(char (*) [12])in_stack_fffffffffffffd48);
  if (pmVar5 != (mapped_type *)0x0) {
    __lhs = local_210;
    common::SettingsSpan::SettingsSpan
              ((SettingsSpan *)in_stack_fffffffffffffd18,
               (vector<UniValue,_std::allocator<UniValue>_> *)
               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    bVar2 = common::SettingsSpan::empty((SettingsSpan *)in_stack_fffffffffffffd18);
    if (!bVar2) {
      __rhs = common::SettingsSpan::begin((SettingsSpan *)in_stack_fffffffffffffd18);
      UniValue::write_abi_cxx11_(local_1d8,(int)__rhs,(void *)0x0,0);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
      std::__cxx11::string::~string(&in_stack_fffffffffffffd08->name);
      local_211 = 0;
      goto LAB_0016bef9;
    }
  }
  local_211 = 1;
LAB_0016bef9:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd08);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_211 & 1);
}

Assistant:

bool ArgsManager::ParseParameters(int argc, const char* const argv[], std::string& error)
{
    LOCK(cs_args);
    m_settings.command_line_options.clear();

    for (int i = 1; i < argc; i++) {
        std::string key(argv[i]);

#ifdef MAC_OSX
        // At the first time when a user gets the "App downloaded from the
        // internet" warning, and clicks the Open button, macOS passes
        // a unique process serial number (PSN) as -psn_... command-line
        // argument, which we filter out.
        if (key.substr(0, 5) == "-psn_") continue;
#endif

        if (key == "-") break; //bitcoin-tx using stdin
        std::optional<std::string> val;
        size_t is_index = key.find('=');
        if (is_index != std::string::npos) {
            val = key.substr(is_index + 1);
            key.erase(is_index);
        }
#ifdef WIN32
        key = ToLower(key);
        if (key[0] == '/')
            key[0] = '-';
#endif

        if (key[0] != '-') {
            if (!m_accept_any_command && m_command.empty()) {
                // The first non-dash arg is a registered command
                std::optional<unsigned int> flags = GetArgFlags(key);
                if (!flags || !(*flags & ArgsManager::COMMAND)) {
                    error = strprintf("Invalid command '%s'", argv[i]);
                    return false;
                }
            }
            m_command.push_back(key);
            while (++i < argc) {
                // The remaining args are command args
                m_command.emplace_back(argv[i]);
            }
            break;
        }

        // Transform --foo to -foo
        if (key.length() > 1 && key[1] == '-')
            key.erase(0, 1);

        // Transform -foo to foo
        key.erase(0, 1);
        KeyInfo keyinfo = InterpretKey(key);
        std::optional<unsigned int> flags = GetArgFlags('-' + keyinfo.name);

        // Unknown command line options and command line options with dot
        // characters (which are returned from InterpretKey with nonempty
        // section strings) are not valid.
        if (!flags || !keyinfo.section.empty()) {
            error = strprintf("Invalid parameter %s", argv[i]);
            return false;
        }

        std::optional<common::SettingsValue> value = InterpretValue(keyinfo, val ? &*val : nullptr, *flags, error);
        if (!value) return false;

        m_settings.command_line_options[keyinfo.name].push_back(*value);
    }

    // we do not allow -includeconf from command line, only -noincludeconf
    if (auto* includes = common::FindKey(m_settings.command_line_options, "includeconf")) {
        const common::SettingsSpan values{*includes};
        // Range may be empty if -noincludeconf was passed
        if (!values.empty()) {
            error = "-includeconf cannot be used from commandline; -includeconf=" + values.begin()->write();
            return false; // pick first value as example
        }
    }
    return true;
}